

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<FileHeader>::reallocateAndGrow
          (QArrayDataPointer<FileHeader> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<FileHeader> *old)

{
  FileHeader *pFVar1;
  Data *pDVar2;
  undefined1 *puVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<FileHeader> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<FileHeader> *)0x0 && where == GrowsAtEnd) {
    pDVar2 = this->d;
    if (pDVar2 == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pDVar2 == (Data *)0x0) {
        lVar6 = 0;
        lVar5 = 0;
      }
      else {
        lVar6 = (pDVar2->super_QArrayData).alloc;
        lVar5 = (this->size - (pDVar2->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3) * -0x1111111111111111;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<FileHeader>::reallocate
                  ((QMovableArrayOps<FileHeader> *)this,lVar6 + n + lVar5,Grow);
        return;
      }
      goto LAB_002701b2;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (FileHeader *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (FileHeader *)0x0)) {
    if (this->size != 0) {
      if (this->d == (Data *)0x0) {
        bVar4 = true;
      }
      else {
        bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pFVar1 = this->ptr;
      if ((old != (QArrayDataPointer<FileHeader> *)0x0) || (bVar4)) {
        QtPrivate::QGenericArrayOps<FileHeader>::copyAppend
                  ((QGenericArrayOps<FileHeader> *)&local_38,pFVar1,
                   pFVar1 + (n >> 0x3f & n) + this->size);
      }
      else {
        QtPrivate::QGenericArrayOps<FileHeader>::moveAppend
                  ((QGenericArrayOps<FileHeader> *)&local_38,pFVar1,
                   pFVar1 + (n >> 0x3f & n) + this->size);
      }
    }
    pDVar2 = this->d;
    pFVar1 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar3 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pFVar1;
    local_38.size = (qsizetype)puVar3;
    if (old != (QArrayDataPointer<FileHeader> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar2;
      old->ptr = pFVar1;
      local_38.size = old->size;
      old->size = (qsizetype)puVar3;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_002701b2:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }